

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O3

uint32_t readindex(HunkInfo *hi)

{
  long *plVar1;
  uint16_t uVar2;
  
  plVar1 = &hi->indexcnt;
  *plVar1 = *plVar1 + -2;
  if (*plVar1 < 0) {
    error(0xd,hi->filename);
  }
  uVar2 = read16be(hi->indexptr);
  hi->indexptr = hi->indexptr + 2;
  return (uint32_t)uVar2;
}

Assistant:

static uint32_t readindex(struct HunkInfo *hi)
{
  uint16_t w;

  if ((hi->indexcnt -= sizeof(uint16_t)) < 0)
    error(13,hi->filename);  /* File format corrupted */
  w = read16be(hi->indexptr);
  hi->indexptr += sizeof(uint16_t);
  return w;
}